

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int ConnectRPLIDARx(RPLIDAR *pRPLIDAR,char *szCfgFilePath)

{
  int iVar1;
  long lVar2;
  void **ppvVar3;
  _Deque_base<double,_std::allocator<double>_> local_78;
  
  ppvVar3 = addrsRPLIDAR;
  lVar2 = 0;
  do {
    if (*ppvVar3 == (void *)0x0) {
      iVar1 = ConnectRPLIDAR(pRPLIDAR,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<double,_std::allocator<double>_>::_Deque_base(&local_78);
      std::deque<double,_std::allocator<double>_>::_M_move_assign1
                ((deque<double,_std::allocator<double>_> *)((long)anglesvectorRPLIDAR - lVar2),
                 &local_78);
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_78);
      local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<double,_std::allocator<double>_>::_Deque_base(&local_78);
      std::deque<double,_std::allocator<double>_>::_M_move_assign1
                ((deque<double,_std::allocator<double>_> *)((long)distancesvectorRPLIDAR - lVar2),
                 &local_78);
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_78);
      *ppvVar3 = pRPLIDAR;
      return 0;
    }
    lVar2 = lVar2 + -0x50;
    ppvVar3 = ppvVar3 + 1;
  } while (lVar2 != -0x500);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectRPLIDARx(RPLIDAR* pRPLIDAR, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectRPLIDAR(pRPLIDAR, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

#ifdef __cplusplus
	anglesvectorRPLIDAR[id] = std::deque<double>();
	distancesvectorRPLIDAR[id] = std::deque<double>();
#endif // __cplusplus

	addrsRPLIDAR[id] = pRPLIDAR;

	return EXIT_SUCCESS;
}